

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

int Abc_NtkDontCareWinAddMissing(Odc_Man_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (iVar3 = 0; iVar3 < p->vLeaves->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,iVar3);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  p->vBranches->nSize = 0;
  iVar3 = 0;
  do {
    if (p->vRoots->nSize <= iVar3) {
      return 1;
    }
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,iVar3);
    iVar1 = Abc_NtkDontCareWinAddMissing_rec(p,pAVar2);
    iVar3 = iVar3 + 1;
  } while (iVar1 != 0);
  return 0;
}

Assistant:

int Abc_NtkDontCareWinAddMissing( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // set the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // explore from the roots
    Vec_PtrClear( p->vBranches );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        if ( !Abc_NtkDontCareWinAddMissing_rec( p, pObj ) )
            return 0;
    return 1;
}